

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialNormalizer.cpp
# Opt level: O0

PolyNf * __thiscall
Kernel::RenderPolyNf::operator()
          (RenderPolyNf *this,PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_> *facs)

{
  Monom *in_RDX;
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *in_RSI;
  PolyNf *in_RDI;
  PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_> *in_stack_00000060;
  RenderMonom *in_stack_00000068;
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> poly;
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *in_stack_ffffffffffffff28;
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *this_00;
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *in_stack_ffffffffffffff90;
  RenderPolyNf *in_stack_ffffffffffffff98;
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> local_38;
  
  RenderMonom::operator()(in_stack_00000068,in_stack_00000060);
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::Polynom(in_RSI,in_RDX);
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::~Monom
            ((Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x92aaeb);
  this_00 = &local_38;
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::integrity(this_00);
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::Polynom(this_00,in_stack_ffffffffffffff28);
  operator()(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::~Polynom
            ((Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x92ab31);
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::~Polynom
            ((Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x92ab3e);
  return in_RDI;
}

Assistant:

PolyNf operator()(PreMonom<NumTraits> facs) const
  {
    auto poly = Polynom<NumTraits>(RenderMonom{}(std::move(facs)));
    poly.integrity();
    return (*this)(std::move(poly));
  }